

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall QTableView::sizeHintForRow(QTableView *this,int row)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTableViewPrivate *index_00;
  QAbstractItemModel *pQVar6;
  int *piVar7;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int logcol_1;
  int logcol;
  int logicalIdx;
  int idxRight;
  int idxLeft;
  int actualRight;
  int logicalColumn;
  int column;
  int columnsProcessed;
  int hint;
  int right;
  int left;
  int maximumProcessCols;
  QTableViewPrivate *d;
  QModelIndex index;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  QAbstractItemModel *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  int iVar8;
  int in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  undefined1 uVar9;
  QWidget *in_stack_fffffffffffffdf8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  undefined4 in_stack_fffffffffffffe60;
  int local_18c;
  QPersistentModelIndex local_188 [3];
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  QPersistentModelIndex local_158 [2];
  int in_stack_fffffffffffffebc;
  QPersistentModelIndex local_140 [3];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  QPersistentModelIndex local_f8 [3];
  int local_e0 [2];
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = d_func((QTableView *)0x8bd67d);
  pQVar6 = QAbstractItemView::model
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (pQVar6 == (QAbstractItemModel *)0x0) {
    local_18c = -1;
  }
  else {
    QWidget::ensurePolished(in_stack_fffffffffffffdf8);
    iVar2 = QHeaderView::resizeContentsPrecision
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
    ;
    local_e0[1] = 0;
    local_e0[0] = QHeaderView::visualIndexAt
                            ((QHeaderView *)
                             CONCAT17(in_stack_fffffffffffffdef,
                                      CONCAT16(in_stack_fffffffffffffdee,
                                               CONCAT24(in_stack_fffffffffffffdec,
                                                        in_stack_fffffffffffffde8))),
                             in_stack_fffffffffffffde4);
    piVar7 = qMax<int>(local_e0 + 1,local_e0);
    local_1c0 = *piVar7;
    QWidget::width((QWidget *)0x8bd738);
    local_1b4 = QHeaderView::visualIndexAt
                          ((QHeaderView *)
                           CONCAT17(in_stack_fffffffffffffdef,
                                    CONCAT16(in_stack_fffffffffffffdee,
                                             CONCAT24(in_stack_fffffffffffffdec,
                                                      in_stack_fffffffffffffde8))),
                           in_stack_fffffffffffffde4);
    if (local_1b4 == -1) {
      pQVar6 = (index_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
      local_1b4 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,local_f8);
      local_1b4 = local_1b4 + -1;
    }
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8bd7c9);
    (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
    local_1b8 = 0;
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8bd824);
    local_1bc = 0;
    local_1cc = local_1c0;
    for (; iVar8 = in_ESI, local_1c0 <= local_1b4; local_1c0 = local_1c0 + 1) {
      iVar3 = QHeaderView::logicalIndex
                        ((QHeaderView *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
      bVar1 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT17(in_stack_fffffffffffffdef,
                                  CONCAT16(in_stack_fffffffffffffdee,
                                           CONCAT24(in_stack_fffffffffffffdec,
                                                    in_stack_fffffffffffffde8))),
                         in_stack_fffffffffffffde4);
      iVar8 = in_ESI;
      if (!bVar1) {
        pQVar6 = (index_00->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_140);
        (**(code **)(*(long *)pQVar6 + 0x60))(&local_128,pQVar6,in_ESI,iVar3,local_140);
        local_110 = local_128;
        local_108 = local_120;
        local_100 = local_118;
        local_1b8 = QTableViewPrivate::heightHintForIndex
                              ((QTableViewPrivate *)CONCAT44(iVar8,in_stack_fffffffffffffe60),
                               (QModelIndex *)index_00,in_stack_fffffffffffffebc,
                               (QStyleOptionViewItem *)CONCAT44(iVar2,local_1cc));
        local_1bc = local_1bc + 1;
        if (local_1bc == iVar2) break;
      }
      in_ESI = iVar8;
    }
    pQVar6 = (index_00->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_158);
    iVar4 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,local_158);
    iVar4 = iVar4 + -1;
    local_1d0 = local_1c0 + -1;
    iVar3 = local_1cc;
    if ((iVar2 == 0) || (iVar4 < local_1cc)) {
      local_1bc = iVar2;
    }
    while( true ) {
      bVar1 = local_1bc != iVar2;
      if (bVar1) {
        in_stack_fffffffffffffdee = 0 < local_1cc || local_1d0 < iVar4;
      }
      uVar9 = bVar1 && (0 < local_1cc || local_1d0 < iVar4);
      if (!bVar1 || 0 >= local_1cc && local_1d0 >= iVar4) break;
      local_1d4 = -1;
      if (((local_1bc % 2 == 0) || (local_1cc < 1)) && (local_1d0 != iVar4)) {
        do {
          iVar5 = local_1d4;
          if (iVar4 <= local_1d0) break;
          local_1d0 = local_1d0 + 1;
          iVar5 = QHeaderView::logicalIndex
                            ((QHeaderView *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
          bVar1 = QHeaderView::isSectionHidden
                            ((QHeaderView *)
                             CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffdee,
                                                     CONCAT24(in_stack_fffffffffffffdec,
                                                              in_stack_fffffffffffffde8))),
                             in_stack_fffffffffffffde4);
        } while (bVar1);
      }
      else {
        do {
          iVar5 = local_1d4;
          if (local_1cc < 1) break;
          local_1cc = local_1cc + -1;
          iVar5 = QHeaderView::logicalIndex
                            ((QHeaderView *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
          bVar1 = QHeaderView::isSectionHidden
                            ((QHeaderView *)
                             CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffdee,
                                                     CONCAT24(in_stack_fffffffffffffdec,
                                                              in_stack_fffffffffffffde8))),
                             in_stack_fffffffffffffde4);
        } while (bVar1);
      }
      local_1d4 = iVar5;
      iVar5 = iVar8;
      if (-1 < local_1d4) {
        in_stack_fffffffffffffdd8 = (index_00->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_188);
        (**(code **)(*(long *)in_stack_fffffffffffffdd8 + 0x60))
                  (&local_170,in_stack_fffffffffffffdd8,iVar8,local_1d4,local_188);
        local_110 = local_170;
        local_108 = local_168;
        local_100 = local_160;
        local_1b8 = QTableViewPrivate::heightHintForIndex
                              ((QTableViewPrivate *)CONCAT44(iVar5,in_stack_fffffffffffffe60),
                               (QModelIndex *)index_00,in_stack_fffffffffffffebc,
                               (QStyleOptionViewItem *)CONCAT44(iVar2,iVar3));
        in_stack_fffffffffffffde4 = iVar8;
        in_stack_fffffffffffffde8 = local_1d4;
      }
      local_1bc = local_1bc + 1;
      iVar8 = iVar5;
    }
    if ((index_00->showGrid & 1U) != 0) {
      local_1b8 = local_1b8 + 1;
    }
    QStyleOptionViewItem::~QStyleOptionViewItem
              ((QStyleOptionViewItem *)CONCAT44(local_1b8,in_stack_fffffffffffffdd0));
    local_18c = local_1b8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18c;
  }
  __stack_chk_fail();
}

Assistant:

int QTableView::sizeHintForRow(int row) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessCols = d->verticalHeader->resizeContentsPrecision();


    int left = qMax(0, d->horizontalHeader->visualIndexAt(0));
    int right = d->horizontalHeader->visualIndexAt(d->viewport->width());
    if (right == -1) // the table don't have enough columns to fill the viewport
        right = d->model->columnCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    QModelIndex index;
    int columnsProcessed = 0;
    int column = left;
    for (; column <= right; ++column) {
        int logicalColumn = d->horizontalHeader->logicalIndex(column);
        if (d->horizontalHeader->isSectionHidden(logicalColumn))
            continue;
        index = d->model->index(row, logicalColumn, d->root);
        hint = d->heightHintForIndex(index, hint, option);

        ++columnsProcessed;
        if (columnsProcessed == maximumProcessCols)
            break;
    }

    const int actualRight = d->model->columnCount(d->root) - 1;
    int idxLeft = left;
    int idxRight = column - 1;

    if (maximumProcessCols == 0 || actualRight < idxLeft)
        columnsProcessed = maximumProcessCols; // skip the while loop

    while (columnsProcessed != maximumProcessCols && (idxLeft > 0 || idxRight < actualRight)) {
        int logicalIdx  = -1;

        if ((columnsProcessed % 2 && idxLeft > 0) || idxRight == actualRight) {
            while (idxLeft > 0) {
                --idxLeft;
                int logcol = d->horizontalHeader->logicalIndex(idxLeft);
                if (d->horizontalHeader->isSectionHidden(logcol))
                    continue;
                logicalIdx = logcol;
                break;
            }
        } else {
            while (idxRight < actualRight) {
                ++idxRight;
                int logcol = d->horizontalHeader->logicalIndex(idxRight);
                if (d->horizontalHeader->isSectionHidden(logcol))
                    continue;
                logicalIdx = logcol;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(row, logicalIdx, d->root);
            hint = d->heightHintForIndex(index, hint, option);
        }
        ++columnsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}